

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

_Bool tcg_out_dup_vec(TCGContext_conflict9 *s,TCGType_conflict type,uint vece,TCGReg r,TCGReg a)

{
  int iVar1;
  TCGReg local_20;
  int vex_l;
  TCGReg a_local;
  TCGReg r_local;
  uint vece_local;
  TCGType_conflict type_local;
  TCGContext_conflict9 *s_local;
  
  if (have_avx2_tricore) {
    iVar1 = 0;
    if (type == TCG_TYPE_V256) {
      iVar1 = 0x80000;
    }
    tcg_out_vex_modrm(s,avx2_dup_insn[vece] + iVar1,r,0,a);
  }
  else {
    local_20 = a;
    switch(vece) {
    case 0:
      tcg_out_vex_modrm(s,0x560,r,a,a);
      local_20 = r;
    case 1:
      tcg_out_vex_modrm(s,0x561,r,local_20,local_20);
      local_20 = r;
    case 2:
      tcg_out_vex_modrm(s,0x570,r,0,local_20);
      tcg_out8(s,'\0');
      break;
    case 3:
      tcg_out_vex_modrm(s,0x56c,r,a,a);
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                 ,0x392,(char *)0x0);
    }
  }
  return true;
}

Assistant:

static bool tcg_out_dup_vec(TCGContext *s, TCGType type, unsigned vece,
                            TCGReg r, TCGReg a)
{
    if (have_avx2) {
        int vex_l = (type == TCG_TYPE_V256 ? P_VEXL : 0);
        tcg_out_vex_modrm(s, avx2_dup_insn[vece] + vex_l, r, 0, a);
    } else {
        switch (vece) {
        case MO_8:
            /* ??? With zero in a register, use PSHUFB.  */
            tcg_out_vex_modrm(s, OPC_PUNPCKLBW, r, a, a);
            a = r;
            /* FALLTHRU */
        case MO_16:
            tcg_out_vex_modrm(s, OPC_PUNPCKLWD, r, a, a);
            a = r;
            /* FALLTHRU */
        case MO_32:
            tcg_out_vex_modrm(s, OPC_PSHUFD, r, 0, a);
            /* imm8 operand: all output lanes selected from input lane 0.  */
            tcg_out8(s, 0);
            break;
        case MO_64:
            tcg_out_vex_modrm(s, OPC_PUNPCKLQDQ, r, a, a);
            break;
        default:
            g_assert_not_reached();
        }
    }
    return true;
}